

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O1

void IremGA20_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint uVar1;
  int *piVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  DEV_SMPL *pDVar6;
  DEV_SMPL *pDVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  
  if (samples != 0) {
    pDVar6 = *outputs;
    pDVar7 = outputs[1];
    uVar9 = 0;
    do {
      lVar11 = 0;
      iVar10 = 0;
      do {
        if ((*(char *)((long)param + lVar11 + 0x4d) == '\0') &&
           (*(char *)((long)param + lVar11 + 0x4c) != '\0')) {
          iVar12 = (int)*(char *)((long)param + lVar11 + 0x4e);
          if (*(char *)((long)param + 0xa4) == '\0') {
            iVar12 = (uint)*(ushort *)((long)param + lVar11 + 0x48) * iVar12;
          }
          else {
            iVar5 = *(int *)((long)param + lVar11 + 0x40);
            iVar12 = (int)((uint)*(ushort *)((long)param + lVar11 + 0x48) *
                          (*(char *)((long)param + lVar11 + 0x4f) * iVar5 +
                          (0x10000 - iVar5) * iVar12)) >> 0x10;
          }
          piVar2 = (int *)((long)param + lVar11 + 0x40);
          *piVar2 = *piVar2 + *(int *)((long)param + lVar11 + 0x44);
          iVar10 = iVar10 + iVar12;
          pcVar3 = (char *)((long)param + lVar11 + 0x4b);
          *pcVar3 = *pcVar3 + '\x01';
          if (*pcVar3 == '\0') {
            iVar12 = *(int *)((long)param + lVar11 + 0x3c);
            uVar1 = iVar12 + 1;
            *(uint *)((long)param + lVar11 + 0x3c) = uVar1;
            *(undefined4 *)((long)param + lVar11 + 0x40) = 0;
            *(undefined1 *)((long)param + lVar11 + 0x4b) =
                 *(undefined1 *)((long)param + lVar11 + 0x4a);
            lVar8 = *(long *)((long)param + 8);
            cVar4 = *(char *)(lVar8 + (ulong)uVar1);
            if (cVar4 == '\0') {
              *(undefined1 *)((long)param + lVar11 + 0x4c) = 0;
            }
            else {
              *(char *)((long)param + lVar11 + 0x4e) = cVar4 + -0x80;
            }
            cVar4 = *(char *)(lVar8 + (ulong)(iVar12 + 2));
            if (cVar4 != '\0') {
              *(char *)((long)param + lVar11 + 0x4f) = cVar4 + -0x80;
            }
          }
        }
        lVar11 = lVar11 + 0x1c;
      } while (lVar11 != 0x70);
      pDVar6[uVar9] = iVar10 >> 2;
      pDVar7[uVar9] = iVar10 >> 2;
      uVar9 = uVar9 + 1;
    } while (uVar9 != samples);
  }
  return;
}

Assistant:

static void IremGA20_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ga20_state *chip = (ga20_state *)param;
	DEV_SMPL *outL, *outR;
	UINT32 i;
	int j;
	DEV_SMPL smpl_int;
	DEV_SMPL sampleout;
	struct IremGA20_channel_def* ch;

	outL = outputs[0];
	outR = outputs[1];

	for (i = 0; i < samples; i++)
	{
		sampleout = 0;

		for (j = 0; j < 4; j++)
		{
			ch = &chip->channel[j];
			if (ch->Muted || ! ch->play)
				continue;
			
			if (! chip->interpolate)
			{
				sampleout += ch->smpl1 * (INT32)ch->volume;
			}
			else
			{
				smpl_int = (ch->smpl1 * ((1 << RATE_SHIFT) - ch->frac) + ch->smpl2 * ch->frac);
				sampleout += (smpl_int * (INT32)ch->volume) >> RATE_SHIFT;
			}
			ch->frac += ch->fracrate;
			ch->counter ++;
			if (! ch->counter)
			{
				// advance position + reset counter on overflow
				ch->pos ++;
				ch->frac = 0;
				ch->counter = ch->rate;
				irem_ga20_cache_samples(chip, ch);
			}
		}

		sampleout >>= 2;
		outL[i] = sampleout;
		outR[i] = sampleout;
	}
}